

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabCallConnect(Parse *pParse,Table *pTab)

{
  VTable *pVVar1;
  char *local_50;
  char *zErr;
  char *zModule;
  Module *pMStack_38;
  int rc;
  Module *pMod;
  char *zMod;
  sqlite3 *db;
  Table *pTab_local;
  Parse *pParse_local;
  
  zMod = (char *)pParse->db;
  if ((pTab->nModuleArg != 0) &&
     (db = (sqlite3 *)pTab, pTab_local = (Table *)pParse,
     pVVar1 = sqlite3GetVTable((sqlite3 *)zMod,pTab), pVVar1 == (VTable *)0x0)) {
    pMod = (Module *)**(undefined8 **)&db->iSysErrno;
    pMStack_38 = (Module *)sqlite3HashFind((Hash *)(zMod + 0x1c8),(char *)pMod);
    if (pMStack_38 == (Module *)0x0) {
      zErr = (char *)**(undefined8 **)&db->iSysErrno;
      sqlite3ErrorMsg((Parse *)pTab_local,"no such module: %s",zErr);
      zModule._4_4_ = 1;
    }
    else {
      local_50 = (char *)0x0;
      zModule._4_4_ =
           vtabCallConstructor((sqlite3 *)zMod,(Table *)db,pMStack_38,pMStack_38->pModule->xConnect,
                               &local_50);
      if (zModule._4_4_ != 0) {
        sqlite3ErrorMsg((Parse *)pTab_local,"%s",local_50);
        *(int *)&pTab_local->pSelect = zModule._4_4_;
      }
      sqlite3DbFree((sqlite3 *)zMod,local_50);
    }
    return zModule._4_4_;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallConnect(Parse *pParse, Table *pTab){
  sqlite3 *db = pParse->db;
  const char *zMod;
  Module *pMod;
  int rc;

  assert( pTab );
  if( !IsVirtual(pTab) || sqlite3GetVTable(db, pTab) ){
    return SQLITE_OK;
  }

  /* Locate the required virtual table module */
  zMod = pTab->azModuleArg[0];
  pMod = (Module*)sqlite3HashFind(&db->aModule, zMod);

  if( !pMod ){
    const char *zModule = pTab->azModuleArg[0];
    sqlite3ErrorMsg(pParse, "no such module: %s", zModule);
    rc = SQLITE_ERROR;
  }else{
    char *zErr = 0;
    rc = vtabCallConstructor(db, pTab, pMod, pMod->pModule->xConnect, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorMsg(pParse, "%s", zErr);
      pParse->rc = rc;
    }
    sqlite3DbFree(db, zErr);
  }

  return rc;
}